

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testXMLSafe.cxx
# Opt level: O1

int testXMLSafe(int param_1,char **param_2)

{
  int iVar1;
  int iVar2;
  test_pair *ptVar3;
  char *pcVar4;
  string out;
  cmXMLSafe xs;
  ostringstream oss;
  long *local_1e0 [2];
  long local_1d0 [2];
  cmXMLSafe local_1c0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  pcVar4 = anon_var_dwarf_171a3a;
  ptVar3 = pairs;
  iVar2 = 0;
  do {
    ptVar3 = ptVar3 + 1;
    cmXMLSafe::cmXMLSafe(&local_1c0,pcVar4);
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    operator<<((ostream *)local_1a8,&local_1c0);
    std::__cxx11::stringbuf::str();
    pcVar4 = ptVar3[-1].out;
    iVar1 = std::__cxx11::string::compare((char *)local_1e0);
    if (iVar1 != 0) {
      printf("expected [%s], got [%s]\n",pcVar4,local_1e0[0]);
      iVar2 = 1;
    }
    if (local_1e0[0] != local_1d0) {
      operator_delete(local_1e0[0],local_1d0[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    pcVar4 = ptVar3->in;
  } while (pcVar4 != (char *)0x0);
  return iVar2;
}

Assistant:

int testXMLSafe(int /*unused*/, char* /*unused*/[])
{
  int result = 0;
  for (test_pair const* p = pairs; p->in; ++p) {
    cmXMLSafe xs(p->in);
    std::ostringstream oss;
    oss << xs;
    std::string out = oss.str();
    if (out != p->out) {
      printf("expected [%s], got [%s]\n", p->out, out.c_str());
      result = 1;
    }
  }
  return result;
}